

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O0

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::way_point_le,std::allocator<xray_re::way_point_le>>,write_point_le>
          (xr_writer *this,
          vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *container)

{
  bool bVar1;
  reference point;
  __normal_iterator<const_xray_re::way_point_le_*,_std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>_>
  local_30;
  const_iterator end;
  const_iterator it;
  vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_> *container_local;
  xr_writer *this_local;
  
  end = std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::begin(container)
  ;
  local_30._M_current =
       (way_point_le *)
       std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>::end(container);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar1) break;
    point = __gnu_cxx::
            __normal_iterator<const_xray_re::way_point_le_*,_std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>_>
            ::operator*(&end);
    write_point_le::operator()((write_point_le *)((long)&this_local + 7),point,this);
    __gnu_cxx::
    __normal_iterator<const_xray_re::way_point_le_*,_std::vector<xray_re::way_point_le,_std::allocator<xray_re::way_point_le>_>_>
    ::operator++(&end);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}